

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.c
# Opt level: O2

void Macro_smpsVcUnusedBits(uint arg_count,long *arg_array)

{
  if (arg_count != 0) {
    vcUnusedBits = (uint)*arg_array;
    vcD1R1Unk = 0;
    vcD1R2Unk = 0;
    vcD1R3Unk = 0;
    vcD1R4Unk = 0;
    if (4 < arg_count) {
      vcD1R1Unk = *(uint *)(arg_array + 1);
      vcD1R2Unk = *(uint *)(arg_array + 2);
      vcD1R3Unk = *(uint *)(arg_array + 3);
      vcD1R4Unk = *(uint *)(arg_array + 4);
    }
    return;
  }
  __assert_fail("arg_count >= 1",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Clownacy[P]smps2asm2bin/instruction.c"
                ,0x4cf,"void Macro_smpsVcUnusedBits(unsigned int, long *)");
}

Assistant:

static void Macro_smpsVcUnusedBits(unsigned int arg_count, long arg_array[])
{
	assert(arg_count >= 1);

	vcUnusedBits = arg_array[0];

	if (arg_count >= 5)
	{
		vcD1R1Unk = arg_array[1];
		vcD1R2Unk = arg_array[2];
		vcD1R3Unk = arg_array[3];
		vcD1R4Unk = arg_array[4];
	}
	else
	{
		vcD1R1Unk = 0;
		vcD1R2Unk = 0;
		vcD1R3Unk = 0;
		vcD1R4Unk = 0;
	}
}